

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint64_t farmhash64_na(char *s,size_t len)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  char *s_00;
  ulong uVar12;
  long lVar13;
  uint128_c_t uVar14;
  uint128_c_t uVar15;
  
  if (0x20 < len) {
    if (len < 0x41) {
      lVar1 = len * 2 + -0x651e95c4d06fbfb1;
      lVar4 = *(long *)s * -0x651e95c4d06fbfb1;
      uVar8 = *(long *)(s + (len - 8)) * lVar1;
      uVar9 = lVar4 + *(long *)(s + 8);
      uVar10 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar5 = lVar4 + *(long *)(s + 0x18);
      uVar12 = (uVar8 >> 0x1e | uVar8 << 0x22) + (uVar9 >> 0x2b | uVar9 * 0x200000) +
               *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
      uVar8 = (uVar10 >> 0x12 | uVar10 << 0x2e) + lVar4 + uVar8;
      uVar9 = (uVar12 ^ uVar8) * lVar1;
      uVar10 = (uVar12 + *(long *)(s + (len - 0x20))) * lVar1;
      uVar8 = (uVar9 >> 0x2f ^ uVar8 ^ uVar9) * lVar1;
      uVar9 = *(long *)(s + 0x10) * lVar1 + *(long *)(s + 0x18);
      uVar5 = (uVar5 >> 0x12 | uVar5 << 0x2e) + *(long *)(s + 0x10) * lVar1 + uVar10;
      uVar9 = ((uVar10 >> 0x1e | uVar10 << 0x22) + (uVar9 >> 0x2b | uVar9 * 0x200000) +
               ((uVar8 >> 0x2f ^ uVar8) * lVar1 + *(long *)(s + (len - 0x18))) * lVar1 ^ uVar5) *
              lVar1;
      uVar9 = (uVar9 >> 0x2f ^ uVar5 ^ uVar9) * lVar1;
      uVar3 = (uVar9 >> 0x2f ^ uVar9) * lVar1;
    }
    else {
      uVar5 = len - 1 & 0xffffffffffffffc0;
      uVar9 = (ulong)((uint)(len - 1) & 0x3f);
      lVar1 = (uVar9 - 0x3f) + uVar5;
      if (s + (len - 0x40) != s + lVar1) {
        __assert_fail("s + len - 64 == last64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash-c.c"
                      ,0x1b1,"uint64_t farmhash64_na(const char *, size_t)");
      }
      lVar13 = *(long *)s + 0x1529cba0ca458ff;
      lVar4 = uVar9 + uVar5;
      s_00 = s + 0x20;
      lVar11 = 0x226bb95b4e64b6d4;
      uVar8 = 0x134a747f856d0526;
      uVar15 = (uint128_c_t)ZEXT816(0);
      uVar14 = (uint128_c_t)ZEXT816(0);
      do {
        uVar8 = uVar8 + uVar15.a;
        uVar12 = lVar13 + uVar14.a + lVar11 + *(long *)(s_00 + -0x18);
        uVar10 = lVar11 + uVar14.b + *(long *)(s_00 + 0x10);
        lVar13 = (uVar8 >> 0x21 | uVar8 * 0x80000000) * -0x4b6d499041670d8d;
        uVar8 = (uVar12 >> 0x25 | uVar12 * 0x8000000) * -0x4b6d499041670d8d ^ uVar15.b;
        lVar11 = uVar14.a + *(long *)(s_00 + 8) +
                 (uVar10 >> 0x2a | uVar10 * 0x400000) * -0x4b6d499041670d8d;
        uVar14 = weak_farmhash_na_len_32_with_seeds
                           (s_00 + -0x20,uVar14.b * -0x4b6d499041670d8d,uVar15.a + uVar8);
        uVar15 = weak_farmhash_na_len_32_with_seeds
                           (s_00,uVar15.b + lVar13,*(long *)(s_00 + -0x10) + lVar11);
        s_00 = s_00 + 0x40;
        uVar5 = uVar5 - 0x40;
      } while (uVar5 != 0);
      lVar6 = uVar15.a + uVar9;
      lVar2 = (uVar8 & 0xff) * 2 + -0x4b6d499041670d8d;
      lVar7 = uVar14.a + lVar6;
      uVar9 = lVar11 + uVar14.b + *(long *)(s + lVar4 + -0xf);
      uVar5 = lVar13 + lVar11 + lVar7 + *(long *)(s + lVar4 + -0x37);
      lVar6 = lVar6 + lVar7;
      uVar8 = uVar8 + lVar6;
      uVar10 = uVar8 >> 0x21 | uVar8 * 0x80000000;
      uVar9 = lVar7 * 9 + *(long *)(s + lVar4 + -0x17) + (uVar9 >> 0x2a | uVar9 * 0x400000) * lVar2;
      uVar8 = uVar15.b * 9 ^ (uVar5 >> 0x25 | uVar5 * 0x8000000) * lVar2;
      uVar14 = weak_farmhash_na_len_32_with_seeds(s + lVar1,uVar14.b * lVar2,lVar6 + uVar8);
      uVar15 = weak_farmhash_na_len_32_with_seeds
                         (s + lVar4 + -0x1f,uVar10 * lVar2 + uVar15.b,
                          *(long *)(s + lVar4 + -0x2f) + uVar9);
      uVar12 = SUB168((undefined1  [16])uVar14 ^ (undefined1  [16])uVar15,0) * lVar2;
      uVar5 = SUB168((undefined1  [16])uVar14 ^ (undefined1  [16])uVar15,8) * lVar2;
      uVar12 = (uVar12 >> 0x2f ^ uVar15.a ^ uVar12) * lVar2;
      uVar5 = (uVar5 >> 0x2f ^ uVar15.b ^ uVar5) * lVar2;
      uVar9 = ((uVar5 >> 0x2f ^ uVar5) + uVar10) * lVar2;
      uVar9 = ((uVar9 >> 0x2f ^ uVar9) * -0x3c5a37a36834ced9 + uVar8 +
               (uVar12 >> 0x2f ^ uVar12) * lVar2 ^ uVar9) * lVar2;
      uVar9 = (uVar9 >> 0x2f ^ uVar9 ^ uVar9) * lVar2;
      uVar3 = (uVar9 >> 0x2f ^ uVar9) * lVar2;
    }
    return uVar3;
  }
  if (len < 0x11) {
    uVar3 = farmhash_na_len_0_to_16(s,len);
    return uVar3;
  }
  uVar3 = farmhash_na_len_17_to_32(s,len);
  return uVar3;
}

Assistant:

uint64_t farmhash64_na(const char *s, size_t len) {
  const uint64_t seed = 81;
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_na_len_33_to_64(s, len);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 56 bytes: v, w, x, y, and z.
  uint64_t x = seed;
  uint64_t y = seed * k1 + 113;
  uint64_t z = smix(y * k2 + 113) * k2;
  uint128_c_t v = make_uint128_c_t(0, 0);
  uint128_c_t w = make_uint128_c_t(0, 0);
  x = x * k2 + fetch64(s);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_na_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
  } while (s != end);
  uint64_t mul = k1 + ((z & 0xff) << 1);
  // Make s point to the last 64 bytes of input.
  s = last64;
  w.a += ((len - 1) & 63);
  v.a += w.a;
  w.a += v.a;
  x = ror64(x + y + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y + v.b + fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a * 9 + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  swap64(&z, &x);
  return farmhash_len_16_mul(farmhash_len_16_mul(v.a, w.a, mul) + smix(y) * k0 + z,
                   farmhash_len_16_mul(v.b, w.b, mul) + x,
                   mul);
}